

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::resample_single_thread
               (image_u8 *src,image_u8 *dst,resample_params *params)

{
  uchar uVar1;
  uint new_height;
  resample_params *this;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char **init6;
  Resampler *pRVar6;
  float *pfVar7;
  Sample *pSVar8;
  uchar *puVar9;
  float fVar10;
  double dVar11;
  undefined4 uVar12;
  float *in_stack_ffffffffffffd978;
  vector<float> *local_2670;
  vector<float> *local_2588;
  uint local_2570;
  int local_256c;
  uint i_4;
  int j;
  int c_3;
  uint x_1;
  color_quad_u8 *pDst;
  bool linear;
  float *pOutput_samples;
  uint local_2540;
  uint comp_index_1;
  uint c_2;
  uint local_2534;
  uint i_3;
  uint c_1;
  uint uStack_2528;
  uint8 v;
  uint comp_index;
  uint c;
  uint x;
  color_quad_u8 *pSrc;
  uint src_y;
  uint dst_y;
  Contrib_List *local_2508;
  float local_2500;
  Boundary_Op local_24fc;
  uint local_24f8;
  uint local_24f4;
  Contrib_List *pCStack_24f0;
  uint i_2;
  char *local_24e8;
  float local_24e0;
  Boundary_Op local_24dc;
  uint local_24d8 [4];
  undefined1 local_24c8 [8];
  vector<float> samples [4];
  Resampler *resamplers [4];
  int k;
  int i_1;
  float inv_source_gamma;
  float inv_linear_to_srgb_table_size;
  uchar linear_to_srgb [8192];
  int local_44c;
  int linear_to_srgb_table_size;
  int i;
  float srgb_to_linear [256];
  color_quad<unsigned_char,_int> local_40;
  float source_gamma;
  uint local_38;
  uint dst_height;
  uint dst_width;
  int cMaxComponents;
  uint src_height;
  uint src_width;
  resample_params *params_local;
  image_u8 *dst_local;
  image_u8 *src_local;
  
  _src_height = params;
  params_local = (resample_params *)dst;
  dst_local = src;
  cMaxComponents = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(src);
  dst_width = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(dst_local);
  uVar4 = math::maximum<unsigned_int>(cMaxComponents,dst_width);
  if (uVar4 < 0x4001) {
    dst_height = 4;
    if (((int)_src_height->m_num_comps < 1) || (4 < (int)_src_height->m_num_comps)) {
      src_local._7_1_ = 0;
    }
    else {
      local_38 = _src_height->m_dst_width;
      source_gamma = (float)_src_height->m_dst_height;
      uVar4 = math::minimum<unsigned_int>(local_38,(uint)source_gamma);
      if ((uVar4 == 0) ||
         (uVar4 = math::maximum<unsigned_int>(local_38,(uint)source_gamma), 0x4000 < uVar4)) {
        printf("Image is too large!\n");
        src_local._7_1_ = 1;
      }
      else {
        if ((cMaxComponents != local_38) || ((float)dst_width != source_gamma)) {
          image<crnlib::color_quad<unsigned_char,_int>_>::clear
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)params_local);
          this = params_local;
          uVar5 = _src_height->m_dst_width;
          new_height = _src_height->m_dst_height;
          color_quad<unsigned_char,_int>::make_black();
          image<crnlib::color_quad<unsigned_char,_int>_>::resize
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)this,uVar5,new_height,
                     0xffffffff,&local_40);
          srgb_to_linear[0xff] = _src_height->m_source_gamma;
          dVar11 = 0.0;
          if ((_src_height->m_srgb & 1U) != 0) {
            for (local_44c = 0; local_44c < 0x100; local_44c = local_44c + 1) {
              dVar11 = std::pow((double)CONCAT44((int)((ulong)dVar11 >> 0x20),
                                                 ((float)local_44c * 1.0) / 255.0),
                                (double)(ulong)(uint)srgb_to_linear[0xff]);
              (&linear_to_srgb_table_size)[local_44c] = SUB84(dVar11,0);
            }
          }
          fVar10 = 1.0 / srgb_to_linear[0xff];
          uVar12 = 0;
          if ((_src_height->m_srgb & 1U) != 0) {
            for (resamplers[3]._4_4_ = 0; resamplers[3]._4_4_ < 0x2000;
                resamplers[3]._4_4_ = resamplers[3]._4_4_ + 1) {
              dVar11 = std::pow((double)CONCAT44(uVar12,(float)resamplers[3]._4_4_ * 0.00012207031),
                                (double)(ulong)(uint)fVar10);
              uVar12 = (undefined4)((ulong)dVar11 >> 0x20);
              resamplers[3]._0_4_ = (int)(SUB84(dVar11,0) * 255.0 + 0.5);
              if ((int)resamplers[3] < 0) {
                resamplers[3]._0_1_ = 0;
              }
              else {
                if (0xff < (int)resamplers[3]) {
                  resamplers[3]._0_4_ = 0xff;
                }
              }
              *(undefined1 *)((long)&inv_source_gamma + (long)resamplers[3]._4_4_) =
                   resamplers[3]._0_1_;
            }
          }
          local_2588 = (vector<float> *)local_24c8;
          do {
            vector<float>::vector(local_2588);
            local_2588 = local_2588 + 1;
          } while (local_2588 != (vector<float> *)&samples[3].m_size);
          local_24d8[0] = ((byte)~_src_height->m_wrapping & 1) * 2;
          local_24dc = BOUNDARY_WRAP;
          local_24e0 = 1.0;
          local_24e8 = (char *)0x0;
          pCStack_24f0 = (Contrib_List *)0x0;
          samples[3]._8_8_ =
               crnlib_new<crnlib::Resampler,unsigned_int,unsigned_int,unsigned_int,unsigned_int,crnlib::Resampler::Boundary_Op,float,float,char_const*,crnlib::Resampler::Contrib_List*,crnlib::Resampler::Contrib_List*,float,float>
                         ((crnlib *)&cMaxComponents,&dst_width,&local_38,(uint *)&source_gamma,
                          local_24d8,&local_24dc,&local_24e0,(float *)&_src_height->m_pFilter,
                          &local_24e8,&stack0xffffffffffffdb10,
                          (Contrib_List **)&_src_height->m_filter_scale,&_src_height->m_filter_scale
                          ,in_stack_ffffffffffffd978);
          vector<float>::resize((vector<float> *)local_24c8,cMaxComponents,false);
          for (local_24f4 = 1; local_24f4 < _src_height->m_num_comps; local_24f4 = local_24f4 + 1) {
            local_24f8 = ((byte)~_src_height->m_wrapping & 1) * 2;
            local_24fc = BOUNDARY_WRAP;
            local_2500 = 1.0;
            init6 = &_src_height->m_pFilter;
            local_2508 = Resampler::get_clist_x((Resampler *)samples[3]._8_8_);
            _src_y = Resampler::get_clist_y((Resampler *)samples[3]._8_8_);
            pRVar6 = crnlib_new<crnlib::Resampler,unsigned_int,unsigned_int,unsigned_int,unsigned_int,crnlib::Resampler::Boundary_Op,float,float,char_const*,crnlib::Resampler::Contrib_List*,crnlib::Resampler::Contrib_List*,float,float>
                               ((crnlib *)&cMaxComponents,&dst_width,&local_38,(uint *)&source_gamma
                                ,&local_24f8,&local_24fc,&local_2500,(float *)init6,
                                (char **)&local_2508,(Contrib_List **)&src_y,
                                (Contrib_List **)&_src_height->m_filter_scale,
                                &_src_height->m_filter_scale,in_stack_ffffffffffffd978);
            resamplers[(ulong)local_24f4 - 1] = pRVar6;
            vector<float>::resize
                      ((vector<float> *)&samples[(ulong)local_24f4 - 1].m_size,cMaxComponents,false)
            ;
          }
          pSrc._4_4_ = 0;
          pSrc._0_4_ = 0;
LAB_0012a48a:
          if ((uint)pSrc < dst_width) {
            _c = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline(dst_local,(uint)pSrc);
            for (comp_index = 0; comp_index < (uint)cMaxComponents; comp_index = comp_index + 1) {
              for (uStack_2528 = 0; uStack_2528 < _src_height->m_num_comps;
                  uStack_2528 = uStack_2528 + 1) {
                uVar5 = _src_height->m_first_comp + uStack_2528;
                bVar2 = color_quad<unsigned_char,_int>::operator[](_c,uVar5);
                if (((_src_height->m_srgb & 1U) == 0) || (uVar5 == 3)) {
                  pfVar7 = vector<float>::operator[]
                                     ((vector<float> *)&samples[(ulong)uStack_2528 - 1].m_size,
                                      comp_index);
                  *pfVar7 = (float)bVar2 * 0.003921569;
                }
                else {
                  fVar10 = (float)(&linear_to_srgb_table_size)[bVar2];
                  pfVar7 = vector<float>::operator[]
                                     ((vector<float> *)&samples[(ulong)uStack_2528 - 1].m_size,
                                      comp_index);
                  *pfVar7 = fVar10;
                }
              }
              _c = _c + 1;
            }
            local_2534 = 0;
LAB_0012a634:
            if (local_2534 < _src_height->m_num_comps) {
              pRVar6 = resamplers[(ulong)local_2534 - 1];
              pfVar7 = vector<float>::operator[]
                                 ((vector<float> *)&samples[(ulong)local_2534 - 1].m_size,0);
              bVar3 = Resampler::put_line(pRVar6,pfVar7);
              if (bVar3) goto LAB_0012a6f5;
              for (c_2 = 0; c_2 < _src_height->m_num_comps; c_2 = c_2 + 1) {
                crnlib_delete<crnlib::Resampler>(resamplers[(ulong)c_2 - 1]);
              }
              src_local._7_1_ = 0;
              goto LAB_0012a9f3;
            }
            goto LAB_0012a70b;
          }
          for (local_2570 = 0; local_2570 < _src_height->m_num_comps; local_2570 = local_2570 + 1) {
            crnlib_delete<crnlib::Resampler>(resamplers[(ulong)local_2570 - 1]);
          }
          src_local._7_1_ = 1;
LAB_0012a9f3:
          local_2670 = (vector<float> *)&samples[3].m_size;
          do {
            local_2670 = local_2670 + -1;
            vector<float>::~vector(local_2670);
          } while (local_2670 != (vector<float> *)local_24c8);
          goto LAB_0012aa72;
        }
        image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)params_local,dst_local);
        src_local._7_1_ = 1;
      }
    }
  }
  else {
    printf("Image is too large!\n");
    src_local._7_1_ = 1;
  }
LAB_0012aa72:
  return (bool)(src_local._7_1_ & 1);
LAB_0012a6f5:
  local_2534 = local_2534 + 1;
  goto LAB_0012a634;
LAB_0012a70b:
  for (local_2540 = 0; local_2540 < _src_height->m_num_comps; local_2540 = local_2540 + 1) {
    uVar5 = _src_height->m_first_comp + local_2540;
    pSVar8 = Resampler::get_line(resamplers[(ulong)local_2540 - 1]);
    if (pSVar8 == (Sample *)0x0) break;
    bVar3 = _src_height->m_srgb;
    _c_3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline
                     ((image<crnlib::color_quad<unsigned_char,_int>_> *)params_local,pSrc._4_4_);
    for (j = 0; (uint)j < local_38; j = j + 1) {
      if ((bVar3 & 1U) == 0 || uVar5 == 3) {
        i_4 = (uint)(pSVar8[(uint)j] * 255.0 + 0.5);
        if ((int)i_4 < 0) {
          i_4._0_1_ = '\0';
        }
        else {
          if (0xff < (int)i_4) {
            i_4 = 0xff;
          }
        }
        puVar9 = color_quad<unsigned_char,_int>::operator[](_c_3,uVar5);
        *puVar9 = (uchar)i_4;
      }
      else {
        local_256c = (int)(pSVar8[(uint)j] * 8192.0 + 0.5);
        if (local_256c < 0) {
          local_256c = 0;
        }
        else if (0x1fff < local_256c) {
          local_256c = 0x1fff;
        }
        uVar1 = *(uchar *)((long)&inv_source_gamma + (long)local_256c);
        puVar9 = color_quad<unsigned_char,_int>::operator[](_c_3,uVar5);
        *puVar9 = uVar1;
      }
      _c_3 = _c_3 + 1;
    }
  }
  if (local_2540 < _src_height->m_num_comps) goto LAB_0012a990;
  pSrc._4_4_ = pSrc._4_4_ + 1;
  goto LAB_0012a70b;
LAB_0012a990:
  pSrc._0_4_ = (uint)pSrc + 1;
  goto LAB_0012a48a;
}

Assistant:

bool resample_single_thread(const image_u8& src, image_u8& dst, const resample_params& params)
        {
            const uint src_width = src.get_width();
            const uint src_height = src.get_height();

            if (math::maximum(src_width, src_height) > CRNLIB_RESAMPLER_MAX_DIMENSION)
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            const int cMaxComponents = 4;
            if (((int)params.m_num_comps < 1) || ((int)params.m_num_comps > (int)cMaxComponents))
            {
                return false;
            }

            const uint dst_width = params.m_dst_width;
            const uint dst_height = params.m_dst_height;

            if ((math::minimum(dst_width, dst_height) < 1) || (math::maximum(dst_width, dst_height) > CRNLIB_RESAMPLER_MAX_DIMENSION))
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            if ((src_width == dst_width) && (src_height == dst_height))
            {
                dst = src;
                return true;
            }

            dst.clear();
            dst.resize(params.m_dst_width, params.m_dst_height);

            // Partial gamma correction looks better on mips. Set to 1.0 to disable gamma correction.
            const float source_gamma = params.m_source_gamma; //1.75f;

            float srgb_to_linear[256];
            if (params.m_srgb)
            {
                for (int i = 0; i < 256; ++i)
                {
                    srgb_to_linear[i] = (float)pow(i * 1.0f / 255.0f, source_gamma);
                }
            }

            const int linear_to_srgb_table_size = 8192;
            unsigned char linear_to_srgb[linear_to_srgb_table_size];

            const float inv_linear_to_srgb_table_size = 1.0f / linear_to_srgb_table_size;
            const float inv_source_gamma = 1.0f / source_gamma;

            if (params.m_srgb)
            {
                for (int i = 0; i < linear_to_srgb_table_size; ++i)
                {
                    int k = (int)(255.0f * pow(i * inv_linear_to_srgb_table_size, inv_source_gamma) + .5f);
                    if (k < 0)
                    {
                        k = 0;
                    }
                    else if (k > 255)
                    {
                        k = 255;
                    }
                    linear_to_srgb[i] = (unsigned char)k;
                }
            }

            Resampler* resamplers[cMaxComponents];
            crnlib::vector<float> samples[cMaxComponents];

            resamplers[0] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                params.m_pFilter, (Resampler::Contrib_List*)nullptr, (Resampler::Contrib_List*)nullptr, params.m_filter_scale, params.m_filter_scale);
            samples[0].resize(src_width);

            for (uint i = 1; i < params.m_num_comps; i++)
            {
                resamplers[i] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                    params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                    params.m_pFilter, resamplers[0]->get_clist_x(), resamplers[0]->get_clist_y(), params.m_filter_scale, params.m_filter_scale);
                samples[i].resize(src_width);
            }

            uint dst_y = 0;

            for (uint src_y = 0; src_y < src_height; src_y++)
            {
                const color_quad_u8* pSrc = src.get_scanline(src_y);

                for (uint x = 0; x < src_width; x++)
                {
                    for (uint c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;
                        const uint8 v = (*pSrc)[comp_index];

                        if (!params.m_srgb || (comp_index == 3))
                        {
                            samples[c][x] = v * (1.0f / 255.0f);
                        }
                        else
                        {
                            samples[c][x] = srgb_to_linear[v];
                        }
                    }

                    pSrc++;
                }

                for (uint c = 0; c < params.m_num_comps; c++)
                {
                    if (!resamplers[c]->put_line(&samples[c][0]))
                    {
                        for (uint i = 0; i < params.m_num_comps; i++)
                        {
                            crnlib_delete(resamplers[i]);
                        }
                        return false;
                    }
                }

                for (;;)
                {
                    uint c;
                    for (c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;

                        const float* pOutput_samples = resamplers[c]->get_line();
                        if (!pOutput_samples)
                        {
                            break;
                        }

                        const bool linear = !params.m_srgb || (comp_index == 3);
                        CRNLIB_ASSERT(dst_y < dst_height);
                        color_quad_u8* pDst = dst.get_scanline(dst_y);

                        for (uint x = 0; x < dst_width; x++)
                        {
                            if (linear)
                            {
                                int c = (int)(255.0f * pOutput_samples[x] + .5f);
                                if (c < 0)
                                {
                                    c = 0;
                                }
                                else if (c > 255)
                                {
                                    c = 255;
                                }
                                (*pDst)[comp_index] = (unsigned char)c;
                            }
                            else
                            {
                                int j = (int)(linear_to_srgb_table_size * pOutput_samples[x] + .5f);
                                if (j < 0)
                                {
                                    j = 0;
                                }
                                else if (j >= linear_to_srgb_table_size)
                                {
                                    j = linear_to_srgb_table_size - 1;
                                }
                                (*pDst)[comp_index] = linear_to_srgb[j];
                            }

                            pDst++;
                        }
                    }
                    if (c < params.m_num_comps)
                    {
                        break;
                    }

                    dst_y++;
                }
            }

            for (uint i = 0; i < params.m_num_comps; i++)
            {
                crnlib_delete(resamplers[i]);
            }

            return true;
        }